

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int cvHandleFailure(CVodeMem cv_mem,int flag)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  sunrealtype sVar4;
  sunrealtype sVar5;
  
  switch(flag) {
  case -0x3a:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg the projection function had repeated recoverable errors.";
    iVar2 = -0x3a;
    iVar1 = 0x1fbf;
    break;
  case -0x39:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg the projection function failed with an unrecoverable error.";
    iVar2 = -0x39;
    iVar1 = 0x1fbb;
    break;
  case -0x38:
    pcVar3 = "proj_mem = NULL illegal.";
    iVar2 = -0x38;
    iVar1 = 0x1fb7;
    goto LAB_0011b321;
  case -0x36:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the quadrature sensitivity right-hand side failed in a recoverable manner, but no recovery is possible."
    ;
    iVar2 = -0x36;
    iVar1 = 0x1f98;
    break;
  case -0x35:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg repeated recoverable quadrature sensitivity right-hand side function errors.";
    iVar2 = -0x35;
    iVar1 = 0x1f9c;
    break;
  case -0x33:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the quadrature sensitivity right-hand side routine failed in an unrecoverable manner."
    ;
    iVar2 = -0x33;
    iVar1 = 0x1f94;
    break;
  case -0x2c:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the sensitivity right-hand side failed in a recoverable manner, but no recovery is possible."
    ;
    iVar2 = -0x2c;
    iVar1 = 0x1f8c;
    break;
  case -0x2b:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg repeated recoverable sensitivity right-hand side function errors.";
    iVar2 = -0x2b;
    iVar1 = 0x1f90;
    break;
  case -0x29:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the sensitivity right-hand side routine failed in an unrecoverable manner.";
    iVar2 = -0x29;
    iVar1 = 0x1f88;
    break;
  case -0x22:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the quadrature right-hand side failed in a recoverable manner, but no recovery is possible."
    ;
    iVar2 = -0x22;
    iVar1 = 0x1f80;
    break;
  case -0x21:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg repeated recoverable quadrature right-hand side function errors.";
    iVar2 = -0x21;
    iVar1 = 0x1f84;
    break;
  case -0x1f:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the quadrature right-hand side routine failed in an unrecoverable manner."
    ;
    iVar2 = -0x1f;
    iVar1 = 0x1f7c;
    break;
  case -0x1b:
    pcVar3 = "tout too close to t0 to start integration.";
    iVar2 = -0x1b;
    iVar1 = 0x1fa0;
    goto LAB_0011b321;
  case -0x15:
    pcVar3 = "cvode_mem = NULL illegal.";
    cv_mem = (CVodeMem)0x0;
    iVar2 = -0x15;
    iVar1 = 0x1fa4;
LAB_0011b321:
    cvProcessError(cv_mem,iVar2,iVar1,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,pcVar3);
    return iVar2;
  case -0x10:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the nonlinear solver failed in an unrecoverable manner.";
    iVar2 = -0x10;
    iVar1 = 0x1fb3;
    break;
  case -0xf:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, unable to satisfy inequality constraints.";
    iVar2 = -0xf;
    iVar1 = 0x1faf;
    break;
  case -0xe:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the nonlinear solver setup failed unrecoverably.";
    iVar2 = -0xe;
    iVar1 = 0x1fab;
    break;
  case -0xc:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
    iVar2 = -0xc;
    iVar1 = 0x1f78;
    break;
  case -0xb:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible.";
    iVar2 = -0xb;
    iVar1 = 0x1f70;
    break;
  case -10:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg repeated recoverable right-hand side function errors.";
    iVar2 = -10;
    iVar1 = 0x1f74;
    break;
  case -8:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
    iVar2 = -8;
    iVar1 = 0x1f6c;
    break;
  case -7:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the solve routine failed in an unrecoverable manner.";
    iVar2 = -7;
    iVar1 = 0x1f68;
    break;
  case -6:
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the setup routine failed in an unrecoverable manner.";
    iVar2 = -6;
    iVar1 = 0x1f64;
    break;
  case -4:
    sVar5 = cv_mem->cv_h;
    sVar4 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg and h = %lg, the corrector convergence test failed repeatedly or with |h| = hmin.";
    iVar2 = -4;
    iVar1 = 0x1f60;
    goto LAB_0011b1f4;
  case -3:
    sVar5 = cv_mem->cv_h;
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.";
    iVar2 = -3;
    iVar1 = 0x1f5c;
LAB_0011b1f4:
    cvProcessError(cv_mem,iVar2,iVar1,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,pcVar3,sVar4,sVar5);
    return iVar2;
  default:
    if (flag == -9999) {
      cvProcessError(cv_mem,-0x15,0x1fa7,"cvHandleFailure",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"At t = %lg, the nonlinear solver was passed a NULL input.",cv_mem->cv_tn);
      return -9999;
    }
  case -0x37:
  case -0x34:
  case -0x32:
  case -0x31:
  case -0x30:
  case -0x2f:
  case -0x2e:
  case -0x2d:
  case -0x2a:
  case -0x28:
  case -0x27:
  case -0x26:
  case -0x25:
  case -0x24:
  case -0x23:
  case -0x20:
  case -0x1e:
  case -0x1d:
  case -0x1c:
  case -0x1a:
  case -0x19:
  case -0x18:
  case -0x17:
  case -0x16:
  case -0x14:
  case -0x13:
  case -0x12:
  case -0x11:
  case -0xd:
  case -9:
  case -5:
    pcVar3 = 
    "CVODES encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
    ;
    iVar2 = -99;
    iVar1 = 0x1fc4;
    goto LAB_0011b321;
  }
  cvProcessError(cv_mem,iVar2,iVar1,"cvHandleFailure",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,pcVar3,sVar5);
  return iVar2;
}

Assistant:

static int cvHandleFailure(CVodeMem cv_mem, int flag)
{
  /* Set vector of  absolute weighted local errors */
  /*
  N_VProd(acor, ewt, tempv);
  N_VAbs(tempv, tempv);
  */

  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case CV_ERR_FAILURE:
    cvProcessError(cv_mem, CV_ERR_FAILURE, __LINE__, __func__, __FILE__,
                   MSGCV_ERR_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_CONV_FAILURE:
    cvProcessError(cv_mem, CV_CONV_FAILURE, __LINE__, __func__, __FILE__,
                   MSGCV_CONV_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_LSETUP_FAIL:
    cvProcessError(cv_mem, CV_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_LSOLVE_FAIL:
    cvProcessError(cv_mem, CV_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SOLVE_FAILED, cv_mem->cv_tn);
    break;
  case CV_RHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_RHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_RHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_RTFUNC_FAIL:
    cvProcessError(cv_mem, CV_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_QRHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_QRHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_QRHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_QRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_QRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QRHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_QRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_QRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QRHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_SRHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_SRHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SRHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_SRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_SRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_SRHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_SRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_SRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_SRHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_QSRHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_QSRHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_QSRHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_QSRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_QSRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QSRHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_QSRHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_QSRHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_QSRHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_TOO_CLOSE:
    cvProcessError(cv_mem, CV_TOO_CLOSE, __LINE__, __func__, __FILE__,
                   MSGCV_TOO_CLOSE);
    break;
  case CV_MEM_NULL:
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    break;
  case SUN_ERR_ARG_CORRUPT:
    cvProcessError(cv_mem, CV_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_INPUT_NULL, cv_mem->cv_tn);
    break;
  case CV_NLS_SETUP_FAIL:
    cvProcessError(cv_mem, CV_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_CONSTR_FAIL:
    cvProcessError(cv_mem, CV_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_FAILED_CONSTR, cv_mem->cv_tn);
    break;
  case CV_NLS_FAIL:
    cvProcessError(cv_mem, CV_NLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_FAIL, cv_mem->cv_tn);
    break;
  case CV_PROJ_MEM_NULL:
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_CV_PROJ_MEM_NULL);
    break;
  case CV_PROJFUNC_FAIL:
    cvProcessError(cv_mem, CV_PROJFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSG_CV_PROJFUNC_FAIL, cv_mem->cv_tn);
    break;
  case CV_REPTD_PROJFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_PROJFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSG_CV_REPTD_PROJFUNC_ERR, cv_mem->cv_tn);
    break;
  default:
    /* This return should never happen */
    cvProcessError(cv_mem, CV_UNRECOGNIZED_ERR, __LINE__, __func__,
                   __FILE__, "CVODES encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov");
    return (CV_UNRECOGNIZED_ERR);
  }

  return (flag);
}